

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.cc
# Opt level: O2

void absl::anon_unknown_2::WritePadding(ostream *o,size_t pad)

{
  undefined1 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  char fill_buf [32];
  
  uVar1 = std::ios::fill();
  auVar3 = pshuflw(ZEXT216(CONCAT11(uVar1,uVar1)),ZEXT216(CONCAT11(uVar1,uVar1)),0);
  fill_buf._0_4_ = auVar3._0_4_;
  fill_buf._4_4_ = fill_buf._0_4_;
  fill_buf._8_4_ = fill_buf._0_4_;
  fill_buf._12_4_ = fill_buf._0_4_;
  fill_buf._16_4_ = fill_buf._0_4_;
  fill_buf._20_4_ = fill_buf._0_4_;
  fill_buf._24_4_ = fill_buf._0_4_;
  fill_buf._28_4_ = fill_buf._0_4_;
  for (; pad != 0; pad = pad - uVar2) {
    uVar2 = 0x20;
    if (pad < 0x20) {
      uVar2 = pad;
    }
    std::ostream::write((char *)o,(long)fill_buf);
  }
  return;
}

Assistant:

void WritePadding(std::ostream& o, size_t pad) {
  char fill_buf[32];
  memset(fill_buf, o.fill(), sizeof(fill_buf));
  while (pad) {
    size_t n = std::min(pad, sizeof(fill_buf));
    o.write(fill_buf, n);
    pad -= n;
  }
}